

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
          (DrawIndirectBase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferTest,
          uint widthTest,uint heightTest,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferRef,
          uint widthRef,uint heightRef)

{
  float *pfVar1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar3;
  int i;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  double dVar13;
  DIResult status;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  ulong local_3a8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_3a0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_398;
  ulong local_390;
  double local_388;
  double local_380;
  Vector<float,_4> local_378;
  Vector<float,_4> local_368;
  Vector<float,_4> local_358;
  Vector<float,_4> local_348;
  DILogger local_338;
  DIResult local_1b8;
  
  local_3a0 = bufferTest;
  local_398 = bufferRef;
  lVar4 = (**(code **)(**(long **)(*(long *)(this + 0x20) + 8) + 0x20))();
  auVar12._0_4_ = (float)(int)(float)(*(int *)(lVar4 + 8) * 0x800000 + 0x3f800000);
  auVar12._4_4_ = (float)(int)(float)(*(int *)(lVar4 + 0xc) * 0x800000 + 0x3f800000);
  auVar12._8_4_ = (float)(int)(float)(*(int *)(lVar4 + 0x10) * 0x800000 + 0x3f800000);
  auVar12._12_4_ = (float)(int)(float)(*(int *)(lVar4 + 0x14) * 0x800000 + 0x3f800000);
  local_378.m_data = (float  [4])divps(_DAT_0166f110,auVar12);
  uVar5 = (ulong)widthTest;
  dVar13 = (double)widthRef / (double)uVar5;
  local_380 = (double)heightRef / (double)heightTest;
  local_3a8 = 0;
  local_3b8 = widthTest;
  local_3b4 = heightTest;
  local_3b0 = widthRef;
  local_390 = uVar5;
  local_388 = dVar13;
  do {
    if ((uint)local_3a8 == local_3b4) {
      return 0;
    }
    iVar8 = (uint)local_3a8 * local_3b8;
    iVar9 = (int)((double)local_3a8 * local_380 + 0.5) * local_3b0;
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      uVar6 = (int)((double)(uVar10 & 0xffffffff) * dVar13 + 0.5) + iVar9;
      uVar7 = (uint)uVar10 + iVar8;
      tcu::Vector<float,_4>::Vector
                (&local_348,
                 (local_3a0->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + uVar7);
      tcu::Vector<float,_4>::Vector
                (&local_358,
                 (local_398->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + uVar6);
      tcu::Vector<float,_4>::Vector(&local_368,&local_378);
      lVar4 = 0;
      while (lVar4 != 3) {
        fVar11 = ABS(local_358.m_data[lVar4] - local_348.m_data[lVar4]);
        pfVar1 = local_368.m_data + lVar4;
        lVar4 = lVar4 + 1;
        if (*pfVar1 <= fVar11 && fVar11 != *pfVar1) {
          local_3bc = (uint)local_3a8;
          local_3ac = (uint)uVar10;
          glcts::anon_unknown_0::DIResult::DIResult(&local_1b8);
          glcts::anon_unknown_0::DIResult::error(&local_338,&local_1b8);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [9])"(x,y)= (");
          pvVar3 = local_398;
          pvVar2 = local_3a0;
          DILogger::operator<<((DILogger *)&local_338,&local_3ac);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x19002bd);
          DILogger::operator<<((DILogger *)&local_338,&local_3bc);
          if (local_338.null_log_ == false) {
            std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                            "). Color RGBA(");
          }
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar2->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar7].m_data);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x19002bd);
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar2->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar7].m_data + 1);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x19002bd);
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar2->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar7].m_data + 2);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x19002bd);
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar2->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar7].m_data + 3);
          if (local_338.null_log_ == false) {
            std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                            ") is different than expected RGBA(");
          }
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar3->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar6].m_data);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x19002bd);
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar3->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar6].m_data + 1);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x19002bd);
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar3->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar6].m_data + 2);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x19002bd);
          DILogger::operator<<
                    ((DILogger *)&local_338,
                     (pvVar3->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar6].m_data + 3);
          DILogger::operator<<((DILogger *)&local_338,(char (*) [2])0x17263e7);
          glcts::anon_unknown_0::DILogger::~DILogger(&local_338);
          glcts::anon_unknown_0::DILogger::~DILogger(&local_1b8.logger_);
          return local_1b8.status_;
        }
      }
      uVar5 = local_390;
      dVar13 = local_388;
    }
    local_3a8 = (ulong)((int)local_3a8 + 1);
  } while( true );
}

Assistant:

long BuffersCompare(const std::vector<T>& bufferTest, unsigned int widthTest, unsigned int heightTest,
						const std::vector<T>& bufferRef, unsigned int widthRef, unsigned int heightRef)
	{

		const tcu::PixelFormat& pixelFormat = m_context.getRenderContext().getRenderTarget().getPixelFormat();
		tcu::Vec4				epsilon		= tcu::Vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		double stepX = widthRef / static_cast<double>(widthTest);
		double stepY = heightRef / static_cast<double>(heightTest);
		for (unsigned int i = 0; i < heightTest; ++i)
		{
			unsigned int offsetTest = i * widthTest;
			unsigned int offsetRef  = static_cast<int>(i * stepY + 0.5) * widthRef;
			for (unsigned int j = 0; j < widthTest; ++j)
			{
				unsigned int posXRef = static_cast<int>(j * stepX + 0.5);
				if (!ColorVerify(bufferTest[j + offsetTest], bufferRef[posXRef + offsetRef], epsilon))
				{
					DIResult status;
					status.error() << "(x,y)= (" << j << "," << i << "). Color RGBA(" << bufferTest[j + offsetTest][0]
								   << "," << bufferTest[j + offsetTest][1] << "," << bufferTest[j + offsetTest][2]
								   << "," << bufferTest[j + offsetTest][3] << ") is different than expected RGBA("
								   << bufferRef[posXRef + offsetRef][0] << "," << bufferRef[posXRef + offsetRef][1]
								   << "," << bufferRef[posXRef + offsetRef][2] << ","
								   << bufferRef[posXRef + offsetRef][3] << ")";
					return status.code();
				}
			}
		}
		return NO_ERROR;
	}